

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<capnp::compiler::CompilerMain::SourceFile> * __thiscall
kj::ArrayBuilder<capnp::compiler::CompilerMain::SourceFile>::operator=
          (ArrayBuilder<capnp::compiler::CompilerMain::SourceFile> *this,
          ArrayBuilder<capnp::compiler::CompilerMain::SourceFile> *other)

{
  SourceFile *pSVar1;
  RemoveConst<capnp::compiler::CompilerMain::SourceFile> *pRVar2;
  SourceFile *pSVar3;
  ArrayDisposer *pAVar4;
  
  pSVar1 = this->ptr;
  if (pSVar1 != (SourceFile *)0x0) {
    pRVar2 = this->pos;
    pSVar3 = this->endPtr;
    this->ptr = (SourceFile *)0x0;
    this->pos = (RemoveConst<capnp::compiler::CompilerMain::SourceFile> *)0x0;
    this->endPtr = (SourceFile *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pSVar1,0x38,((long)pRVar2 - (long)pSVar1 >> 3) * 0x6db6db6db6db6db7,
               ((long)pSVar3 - (long)pSVar1 >> 3) * 0x6db6db6db6db6db7,0);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (SourceFile *)0x0;
  other->pos = (RemoveConst<capnp::compiler::CompilerMain::SourceFile> *)0x0;
  other->endPtr = (SourceFile *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }